

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

double __thiscall VCCluster::energyWithoutItem(VCCluster *this,VCFace *f)

{
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar1;
  long in_RSI;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RDI;
  ReturnType RVar2;
  ReturnType RVar3;
  Vector3d zi;
  double a;
  Vector3d ws;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff70;
  double dVar4;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff88;
  
  pMVar1 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(in_RDI + 0x40);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*
            (pMVar1,(Scalar *)in_stack_ffffffffffffff70);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-(in_stack_ffffffffffffff88,in_RDI);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RDI,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)pMVar1);
  pMVar1 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           (*(double *)(in_RDI + 0x58) - *(double *)(in_RSI + 0x120));
  (**(code **)(*(long *)in_RDI + 0x38))(&stack0xffffffffffffff88);
  if (((double)pMVar1 != 0.0) || (NAN((double)pMVar1))) {
    RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                      (in_stack_ffffffffffffff70,pMVar1);
    RVar3 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                      (in_stack_ffffffffffffff70,pMVar1);
    dVar4 = (double)pMVar1 * RVar2 + -(RVar3 * 2.0);
  }
  else {
    dVar4 = 0.0;
  }
  return dVar4;
}

Assistant:

double VCCluster::energyWithoutItem(VCFace* f) {
	Vector3d ws = weightedSum - f->center * f->area;
	double a = area - f->area;
	Vector3d zi = center();
	return a == 0 ? ENG_NULL : a * zi.dot(zi) - 2 * zi.dot(ws);
}